

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O0

int __thiscall Conn::do_send(Conn *this,ConnInfo *conn_info)

{
  int __fd;
  uint uVar1;
  FILE *__stream;
  Buff *this_00;
  size_t sVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar6;
  int local_2c;
  int nsend;
  Buff *buf;
  ConnInfo *conn_info_local;
  Conn *this_local;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  this_00 = &conn_info->buf;
  local_2c = 0;
  sVar2 = Buff::data_size(this_00);
  if (sVar2 != 0) {
    __fd = conn_info->fd;
    pcVar5 = (conn_info->buf)._w_pos;
    sVar2 = Buff::data_size(this_00);
    sVar3 = write(__fd,pcVar5,sVar2);
    local_2c = (int)sVar3;
  }
  if (local_2c < 0) {
    piVar4 = __errno_location();
    __stream = _stderr;
    if (*piVar4 != 0xb) {
      uVar1 = conn_info->fd;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(__stream,"%s(%d)-<%s>: send fd: %d occurs error, error: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
              ,0xa9,"do_send",(ulong)uVar1,pcVar5);
      fflush(_stderr);
      exit(-5);
    }
  }
  else {
    fprintf(_stderr,"%s(%d)-<%s>: send fd: %d done, total nbytes: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
            ,0xaf,"do_send",(ulong)(uint)conn_info->fd,CONCAT44(uVar6,local_2c));
    fflush(_stderr);
    Buff::set_w_pos(this_00,local_2c);
    if (((conn_info->readeof & 1U) != 0) && (sVar2 = Buff::data_size(this_00), sVar2 == 0)) {
      return -4;
    }
  }
  return 0;
}

Assistant:

int Conn::do_send(ConnInfo *conn_info)
{
    Buff &buf = conn_info->buf;
    int nsend = 0;

    if (buf.data_size() > 0)
    {
        nsend = write(conn_info->fd, buf._w_pos, buf.data_size());
    }
    
    if (nsend < 0)
    {
        if (errno != EAGAIN)
        {
            LOG_PRINT("send fd: %d occurs error, error: %s", conn_info->fd, strerror(errno));
            exit(err_svr_send_error);
        }
    }
    else
    {
        LOG_PRINT("send fd: %d done, total nbytes: %d", conn_info->fd, nsend);
        buf.set_w_pos(nsend);
        if (conn_info->readeof && buf.data_size() == 0)
        {
            return err_svr_send_disconn;
        }
    }

    return err_svr_send_normal;
}